

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O1

error tex_type<28>(context *ctx,token *token,opcode *op)

{
  ulong *in_RCX;
  ulong uVar1;
  optional<unsigned_long> oVar2;
  token local_58;
  
  oVar2 = find_in_table((token *)op,tex_type<28>::types,(string_view)(ZEXT816(0x131b74) << 0x40));
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    fail((token *)ctx,(char *)op,
         "expected 1D, ARRAY_1D, 2D, ARRAY_2D, 3D, ARRAY_3D, CUBE, or ARRAY_CUBE");
  }
  else {
    context::tokenize(&local_58,(context *)token);
    *(int *)&op[2].value = local_58.column;
    op[1].value = (uint64_t)local_58.data.string._M_str;
    op[1].reuse = local_58.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
    op->value = (uint64_t)local_58.filename;
    op->reuse = local_58.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    uVar1 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload << 0x1c;
    if ((*in_RCX & uVar1) != 0) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    *in_RCX = *in_RCX | uVar1;
    ctx->pc = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(tex_type)
{
    static const char* types[]{
        "1D", "ARRAY_1D", "2D", "ARRAY_2D", "3D", "ARRAY_3D", "CUBE", "ARRAY_CUBE",
    };
    const std::optional<uint64_t> result = find_in_table(token, types, "");
    if (!result) {
        return fail(token,
                    "expected 1D, ARRAY_1D, 2D, ARRAY_2D, 3D, ARRAY_3D, CUBE, or ARRAY_CUBE");
    }
    token = ctx.tokenize();
    op.add_bits(*result << address);
    return {};
}